

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::evaluateCost
          (CostAttributes *this,double time,VectorDynSize *values,double *costValue,string *label)

{
  VectorDynSize *vec;
  element_type *peVar1;
  element_type *peVar2;
  Scalar SVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  undefined4 extraout_var;
  ulong uVar10;
  undefined4 extraout_var_00;
  ostream *poVar11;
  bool isValid;
  ostringstream errorMsg;
  char local_201;
  PointerType local_200;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1f8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1d8;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_1a8;
  PointerType local_168;
  long lStack_160;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_148 [11];
  
  if (this->m_valid == false) {
    *costValue = 0.0;
LAB_00199e5e:
    bVar4 = true;
  }
  else {
    local_200 = (PointerType)time;
    lVar8 = iDynTree::VectorDynSize::size();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar9 = iDynTree::MatrixDynSize::cols();
    if (lVar8 == lVar9) {
      peVar1 = (this->desiredTrajectory).
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar5 = (*peVar1->_vptr_TimeVaryingObject[2])((int)local_200,peVar1,&local_201);
      if (local_201 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar11 = std::operator<<((ostream *)&local_1a8,"Unable to retrieve a valid desired ");
        poVar11 = std::operator<<(poVar11,(string *)label);
        std::operator<<(poVar11," at time: ");
        poVar11 = std::ostream::_M_insert<double>((double)local_200);
        std::operator<<(poVar11,".");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("L2NormCost","costEvaluation",
                   (char *)local_1f8.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
      else {
        uVar6 = iDynTree::VectorDynSize::size();
        uVar10 = iDynTree::VectorDynSize::size();
        if (uVar10 == uVar6) {
          peVar2 = (this->selector).
                   super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar7 = (*peVar2->_vptr_Selector[2])(peVar2,values);
          toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                  &local_1f8,(VectorDynSize *)CONCAT44(extraout_var_00,iVar7));
          toEigen(&local_1c0,(VectorDynSize *)CONCAT44(extraout_var,iVar5));
          local_1a8.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = (undefined1)
                    local_1f8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value;
          local_1a8.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1f8.
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_1a8.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_1f8.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_1c0.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_1c0.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_1_ = local_1c0.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    ._16_1_;
          vec = &this->buffer;
          toEigen(&local_1d8,vec);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                    (&local_1d8,&local_1a8);
          toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1c0
                  ,vec);
          local_200 = local_1c0.
                      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          toEigen(&local_1f8,&this->weightMatrix);
          toEigen(&local_1d8,vec);
          local_1a8.m_lhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_8_ = local_1c0.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_rows.m_value;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)0x3fe0000000000000;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value = (long)local_200;
          local_1a8.m_rhs.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          ._16_8_ = local_1c0.
                    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_rows.m_value;
          local_1a8._48_1_ =
               local_1c0.
               super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ._16_1_;
          local_168 = local_1f8.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
          lStack_160 = local_1f8.
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_rows.m_value;
          local_148[0]._0_8_ = local_1d8._0_8_;
          local_148[0]._8_8_ = local_1d8._8_8_;
          local_148[0]._16_1_ = local_1d8._16_1_;
          SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                            ((dense_product_base *)&local_1a8);
          *costValue = SVar3;
          goto LAB_00199e5e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar11 = std::operator<<((ostream *)&local_1a8,"The desired ");
        poVar11 = std::operator<<(poVar11,(string *)label);
        std::operator<<(poVar11," dimension does not match the size of the selector at time: ");
        poVar11 = std::ostream::_M_insert<double>((double)local_200);
        std::operator<<(poVar11,".");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("L2NormCost","costEvaluation",
                   (char *)local_1f8.
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_data);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar11 = std::operator<<((ostream *)&local_1a8,"The ");
      poVar11 = std::operator<<(poVar11,(string *)label);
      std::operator<<(poVar11," dimension is not the one expected from the specified selector.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("L2NormCost","costEvaluation",
                 (char *)local_1f8.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool evaluateCost(double time, const VectorDynSize& values, double& costValue, const std::string &label) {
                if (!isValid()) {
                    costValue = 0.0;
                    return true;
                }

                if (values.size() != selector->asSelectorMatrix().cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The " << label <<" dimension is not the one expected from the specified selector.";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                bool isValid;
                const VectorDynSize& desired = desiredTrajectory->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid desired " << label <<" at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (selector->size() != desired.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The desired " << label <<" dimension does not match the size of the selector at time: " << time << ".";
                    reportError("L2NormCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                iDynTree::toEigen(buffer) = iDynTree::toEigen(selector->select(values)) - iDynTree::toEigen(desired);


                costValue = 0.5 * iDynTree::toEigen(buffer).transpose() * (iDynTree::toEigen(weightMatrix) * iDynTree::toEigen(buffer));

                return true;
            }